

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaInfo::addRecursingType(SchemaInfo *this,DOMElement *elem,XMLCh *name)

{
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar1;
  ValueVectorOf<const_char16_t_*> *this_00;
  XMLCh *name_local;
  DOMElement *elem_local;
  
  pVVar1 = this->fRecursingAnonTypes;
  name_local = name;
  elem_local = elem;
  if (pVVar1 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
    pVVar1 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
             XMemory::operator_new(0x28,this->fMemoryManager);
    ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ValueVectorOf
              (pVVar1,8,this->fMemoryManager,false);
    this->fRecursingAnonTypes = pVVar1;
    this_00 = (ValueVectorOf<const_char16_t_*> *)XMemory::operator_new(0x28,this->fMemoryManager);
    ValueVectorOf<const_char16_t_*>::ValueVectorOf(this_00,8,this->fMemoryManager,false);
    this->fRecursingTypeNames = this_00;
    pVVar1 = this->fRecursingAnonTypes;
  }
  ValueVectorOf<const_xercesc_4_0::DOMElement_*>::addElement(pVVar1,&elem_local);
  ValueVectorOf<const_char16_t_*>::addElement(this->fRecursingTypeNames,&name_local);
  return;
}

Assistant:

inline void SchemaInfo::addRecursingType(const DOMElement* const elem,
                                         const XMLCh* const name) {

    if (!fRecursingAnonTypes) {
        fRecursingAnonTypes = new (fMemoryManager) ValueVectorOf<const DOMElement*>(8, fMemoryManager);
        fRecursingTypeNames = new (fMemoryManager) ValueVectorOf<const XMLCh*>(8, fMemoryManager);
    }

    fRecursingAnonTypes->addElement(elem);
    fRecursingTypeNames->addElement(name);
}